

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

string * __thiscall
t_cpp_generator::namespace_prefix(string *__return_storage_ptr__,t_cpp_generator *this,string *ns)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80 [32];
  string local_60 [32];
  long local_40;
  size_type loc;
  allocator local_22;
  undefined1 local_21;
  string *local_20;
  string *ns_local;
  t_cpp_generator *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = ns;
  ns_local = (string *)this;
  this_local = (t_cpp_generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__," ::",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    while (local_40 = std::__cxx11::string::find((char *)ns,0x4e5538), local_40 != -1) {
      std::__cxx11::string::substr((ulong)local_60,(ulong)ns);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_60);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"::");
      std::__cxx11::string::substr((ulong)local_80,(ulong)ns);
      std::__cxx11::string::operator=((string *)ns,local_80);
      std::__cxx11::string::~string(local_80);
    }
    lVar1 = std::__cxx11::string::size();
    if (lVar1 != 0) {
      std::operator+(&local_a0,ns,"::");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::namespace_prefix(string ns) {
  // Always start with "::", to avoid possible name collisions with
  // other names in one of the current namespaces.
  //
  // We also need a leading space, in case the name is used inside of a
  // template parameter.  "MyTemplate<::foo::Bar>" is not valid C++,
  // since "<:" is an alternative token for "[".
  string result = " ::";

  if (ns.size() == 0) {
    return result;
  }
  string::size_type loc;
  while ((loc = ns.find(".")) != string::npos) {
    result += ns.substr(0, loc);
    result += "::";
    ns = ns.substr(loc + 1);
  }
  if (ns.size() > 0) {
    result += ns + "::";
  }
  return result;
}